

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleIni.h
# Opt level: O2

SI_Error __thiscall
CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::LoadData
          (CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_> *this,
          istream *a_istream)

{
  SI_Error SVar1;
  string strData;
  char szBuf [512];
  string local_248;
  undefined1 local_228 [520];
  
  local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
  local_248._M_string_length = 0;
  local_248.field_2._M_local_buf[0] = '\0';
  do {
    std::istream::get((char *)a_istream,(long)local_228,'\0');
    std::__cxx11::string::append((char *)&local_248);
  } while (*(int *)(a_istream + *(long *)(*(long *)a_istream + -0x18) + 0x20) == 0);
  SVar1 = LoadData(this,&local_248);
  std::__cxx11::string::~string((string *)&local_248);
  return SVar1;
}

Assistant:

SI_Error CSimpleIniTempl<SI_CHAR, SI_STRLESS, SI_CONVERTER>::LoadData(std::istream &a_istream) {
	std::string strData;
	char szBuf[512];
	do {
		a_istream.get(szBuf, sizeof(szBuf), '\0');
		strData.append(szBuf);
	} while (a_istream.good());
	return LoadData(strData);
}